

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  ImTextureID user_texture_id;
  ImFont *font_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [11];
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  short sVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  ImU32 IVar20;
  size_t sVar21;
  ImVec4 *pIVar22;
  ImGuiIO *pIVar23;
  value_type *ppIVar24;
  ImFontConfig *pIVar25;
  ImFontGlyph *pIVar26;
  ImDrawList *this;
  ImVec4 *pIVar27;
  char *pcVar28;
  undefined1 extraout_XMM0_Ba;
  undefined1 extraout_XMM0_Ba_00;
  undefined1 extraout_XMM0_Ba_01;
  undefined1 extraout_XMM0_Ba_02;
  undefined1 extraout_XMM0_Ba_03;
  undefined1 extraout_XMM0_Ba_04;
  undefined1 extraout_XMM0_Ba_05;
  undefined1 uVar29;
  undefined1 extraout_XMM0_Ba_06;
  undefined1 extraout_XMM0_Ba_07;
  undefined1 extraout_XMM0_Ba_08;
  undefined1 extraout_XMM0_Ba_09;
  undefined1 extraout_XMM0_Ba_10;
  undefined1 extraout_XMM0_Ba_11;
  undefined1 extraout_XMM0_Ba_12;
  undefined1 extraout_XMM0_Ba_13;
  undefined1 extraout_XMM0_Ba_14;
  undefined1 extraout_XMM0_Ba_15;
  undefined1 extraout_XMM0_Ba_16;
  undefined1 extraout_XMM0_Ba_17;
  undefined1 extraout_XMM0_Ba_18;
  undefined1 extraout_XMM0_Ba_19;
  undefined1 extraout_XMM0_Ba_20;
  undefined1 extraout_XMM0_Ba_21;
  undefined1 extraout_XMM0_Ba_22;
  undefined1 extraout_XMM0_Ba_23;
  undefined1 extraout_XMM0_Ba_24;
  undefined1 extraout_XMM0_Ba_25;
  undefined1 extraout_XMM0_Ba_26;
  undefined1 extraout_XMM0_Ba_27;
  undefined1 extraout_XMM0_Ba_28;
  char extraout_XMM0_Ba_29;
  char extraout_XMM0_Ba_30;
  undefined1 extraout_XMM0_Ba_31;
  undefined1 extraout_XMM0_Ba_32;
  undefined1 extraout_XMM0_Ba_33;
  undefined1 extraout_XMM0_Ba_34;
  char cVar30;
  undefined1 extraout_XMM0_Ba_35;
  char extraout_XMM0_Ba_36;
  undefined1 extraout_XMM0_Ba_37;
  undefined1 extraout_XMM0_Ba_38;
  undefined1 extraout_XMM0_Ba_39;
  undefined1 extraout_XMM0_Bb;
  undefined1 extraout_XMM0_Bb_00;
  undefined1 extraout_XMM0_Bb_01;
  undefined1 extraout_XMM0_Bb_02;
  undefined1 extraout_XMM0_Bb_03;
  undefined1 extraout_XMM0_Bb_04;
  undefined1 extraout_XMM0_Bb_05;
  undefined1 uVar31;
  undefined1 extraout_XMM0_Bb_06;
  undefined1 extraout_XMM0_Bb_07;
  undefined1 extraout_XMM0_Bb_08;
  undefined1 extraout_XMM0_Bb_09;
  undefined1 extraout_XMM0_Bb_10;
  undefined1 extraout_XMM0_Bb_11;
  undefined1 extraout_XMM0_Bb_12;
  undefined1 extraout_XMM0_Bb_13;
  undefined1 extraout_XMM0_Bb_14;
  undefined1 extraout_XMM0_Bb_15;
  undefined1 extraout_XMM0_Bb_16;
  undefined1 extraout_XMM0_Bb_17;
  undefined1 extraout_XMM0_Bb_18;
  undefined1 extraout_XMM0_Bb_19;
  undefined1 extraout_XMM0_Bb_20;
  undefined1 extraout_XMM0_Bb_21;
  undefined1 extraout_XMM0_Bb_22;
  undefined1 extraout_XMM0_Bb_23;
  undefined1 extraout_XMM0_Bb_24;
  undefined1 extraout_XMM0_Bb_25;
  undefined1 extraout_XMM0_Bb_26;
  undefined1 extraout_XMM0_Bb_27;
  undefined1 extraout_XMM0_Bb_28;
  char extraout_XMM0_Bb_29;
  char extraout_XMM0_Bb_30;
  undefined1 extraout_XMM0_Bb_31;
  undefined1 extraout_XMM0_Bb_32;
  undefined1 extraout_XMM0_Bb_33;
  undefined1 extraout_XMM0_Bb_34;
  char cVar32;
  undefined1 extraout_XMM0_Bb_35;
  char extraout_XMM0_Bb_36;
  undefined1 extraout_XMM0_Bb_37;
  undefined1 extraout_XMM0_Bb_38;
  undefined1 extraout_XMM0_Bb_39;
  undefined1 extraout_XMM0_Bc;
  undefined1 extraout_XMM0_Bc_00;
  undefined1 uVar33;
  undefined1 extraout_XMM0_Bc_01;
  undefined1 extraout_XMM0_Bc_02;
  undefined1 extraout_XMM0_Bc_03;
  undefined1 extraout_XMM0_Bc_04;
  undefined1 extraout_XMM0_Bc_05;
  undefined1 extraout_XMM0_Bc_06;
  undefined1 extraout_XMM0_Bc_07;
  undefined1 extraout_XMM0_Bc_08;
  undefined1 extraout_XMM0_Bc_09;
  undefined1 extraout_XMM0_Bc_10;
  undefined1 extraout_XMM0_Bc_11;
  undefined1 extraout_XMM0_Bc_12;
  undefined1 extraout_XMM0_Bc_13;
  undefined1 extraout_XMM0_Bc_14;
  undefined1 extraout_XMM0_Bc_15;
  undefined1 extraout_XMM0_Bc_16;
  undefined1 extraout_XMM0_Bc_17;
  undefined1 extraout_XMM0_Bc_18;
  undefined1 extraout_XMM0_Bc_19;
  undefined1 extraout_XMM0_Bc_20;
  undefined1 extraout_XMM0_Bc_21;
  undefined1 extraout_XMM0_Bc_22;
  undefined1 extraout_XMM0_Bc_23;
  undefined1 extraout_XMM0_Bc_24;
  undefined1 extraout_XMM0_Bc_25;
  undefined1 extraout_XMM0_Bc_26;
  undefined1 extraout_XMM0_Bc_27;
  undefined1 extraout_XMM0_Bc_28;
  char extraout_XMM0_Bc_29;
  char extraout_XMM0_Bc_30;
  undefined1 extraout_XMM0_Bc_31;
  undefined1 extraout_XMM0_Bc_32;
  undefined1 extraout_XMM0_Bc_33;
  undefined1 extraout_XMM0_Bc_34;
  char cVar34;
  undefined1 extraout_XMM0_Bc_35;
  char extraout_XMM0_Bc_36;
  undefined1 extraout_XMM0_Bc_37;
  undefined1 extraout_XMM0_Bc_38;
  undefined1 extraout_XMM0_Bc_39;
  undefined1 extraout_XMM0_Bd;
  undefined1 extraout_XMM0_Bd_00;
  undefined1 uVar35;
  undefined1 extraout_XMM0_Bd_01;
  undefined1 extraout_XMM0_Bd_02;
  undefined1 extraout_XMM0_Bd_03;
  undefined1 extraout_XMM0_Bd_04;
  undefined1 extraout_XMM0_Bd_05;
  undefined1 extraout_XMM0_Bd_06;
  undefined1 extraout_XMM0_Bd_07;
  undefined1 extraout_XMM0_Bd_08;
  undefined1 extraout_XMM0_Bd_09;
  undefined1 extraout_XMM0_Bd_10;
  undefined1 extraout_XMM0_Bd_11;
  undefined1 extraout_XMM0_Bd_12;
  undefined1 extraout_XMM0_Bd_13;
  undefined1 extraout_XMM0_Bd_14;
  undefined1 extraout_XMM0_Bd_15;
  undefined1 extraout_XMM0_Bd_16;
  undefined1 extraout_XMM0_Bd_17;
  undefined1 extraout_XMM0_Bd_18;
  undefined1 extraout_XMM0_Bd_19;
  undefined1 extraout_XMM0_Bd_20;
  undefined1 extraout_XMM0_Bd_21;
  undefined1 extraout_XMM0_Bd_22;
  undefined1 extraout_XMM0_Bd_23;
  undefined1 extraout_XMM0_Bd_24;
  undefined1 extraout_XMM0_Bd_25;
  undefined1 extraout_XMM0_Bd_26;
  undefined1 extraout_XMM0_Bd_27;
  undefined1 extraout_XMM0_Bd_28;
  char extraout_XMM0_Bd_29;
  char extraout_XMM0_Bd_30;
  undefined1 extraout_XMM0_Bd_31;
  undefined1 extraout_XMM0_Bd_32;
  undefined1 extraout_XMM0_Bd_33;
  undefined1 extraout_XMM0_Bd_34;
  char cVar36;
  undefined1 extraout_XMM0_Bd_35;
  char extraout_XMM0_Bd_36;
  undefined1 extraout_XMM0_Bd_37;
  undefined1 extraout_XMM0_Bd_38;
  undefined1 extraout_XMM0_Bd_39;
  undefined1 extraout_XMM0_Be;
  char cVar37;
  undefined1 extraout_XMM0_Be_00;
  undefined1 extraout_XMM0_Be_01;
  undefined1 extraout_XMM0_Be_02;
  undefined1 extraout_XMM0_Bf;
  char cVar38;
  undefined1 extraout_XMM0_Bf_00;
  undefined1 extraout_XMM0_Bf_01;
  undefined1 extraout_XMM0_Bf_02;
  undefined1 extraout_XMM0_Bg;
  char cVar39;
  undefined1 extraout_XMM0_Bg_00;
  undefined1 extraout_XMM0_Bg_01;
  undefined1 extraout_XMM0_Bg_02;
  undefined1 extraout_XMM0_Bh;
  char cVar40;
  undefined1 extraout_XMM0_Bh_00;
  undefined1 extraout_XMM0_Bh_01;
  undefined1 extraout_XMM0_Bh_02;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  byte bVar48;
  ImVec4 IVar49;
  char *local_1b8;
  float local_174;
  float local_16c;
  float local_164;
  ImVec2 local_160;
  ImVec2 local_158;
  ImFontGlyph *local_150;
  ImFontGlyph *glyph;
  ImVec2 cell_p2;
  ImVec2 cell_p1;
  int n_1;
  ImDrawList *draw_list;
  float fStack_120;
  ImVec2 base_pos;
  float cell_spacing;
  float cell_size;
  int n;
  int count;
  int base;
  ImFontConfig *cfg;
  int config_i;
  bool font_details_opened;
  ImFont *font;
  int i_2;
  ImVec4 local_d8;
  ImColor local_c8;
  ImVec4 local_b8;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImFontAtlas *local_90;
  ImFontAtlas *atlas;
  bool fonts_opened;
  ImVec2 local_78;
  char *local_70;
  char *name_1;
  int i_1;
  char *local_58;
  char *name;
  ImVec4 *col;
  int i;
  ImVec2 local_38;
  ImVec2 local_30;
  bool local_27;
  bool local_26;
  bool local_25 [6];
  bool popup_border;
  bool frame_border;
  bool window_border;
  ImGuiStyle *local_18;
  ImGuiStyle *style;
  ImGuiStyle *ref_local;
  
  style = ref;
  local_18 = GetStyle();
  if ((ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') &&
     (iVar19 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style), iVar19 != 0)) {
    ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
    __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
  }
  if (((ShowStyleEditor::init & 1U) != 0) && (style == (ImGuiStyle *)0x0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_18,0x338);
  }
  ShowStyleEditor::init = false;
  if (style == (ImGuiStyle *)0x0) {
    style = &ShowStyleEditor::ref_saved_style;
  }
  fVar5 = GetWindowWidth();
  PushItemWidth(fVar5 * 0.5);
  bVar17 = ShowStyleSelector("Colors##Selector");
  if (bVar17) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_18,0x338);
  }
  ShowFontSelector("Fonts##Selector");
  bVar17 = SliderFloat("FrameRounding",&local_18->FrameRounding,
                       (float)(CONCAT13(extraout_XMM0_Bd,
                                        CONCAT12(extraout_XMM0_Bc,
                                                 CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))) ^
                              CONCAT13(extraout_XMM0_Bd,
                                       CONCAT12(extraout_XMM0_Bc,
                                                CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba)))),12.0,
                       "%.0f",1.0);
  if (bVar17) {
    local_18->GrabRounding = local_18->FrameRounding;
  }
  local_25[0] = 0.0 < local_18->WindowBorderSize;
  bVar17 = Checkbox("WindowBorder",local_25);
  uVar29 = extraout_XMM0_Ba_00;
  uVar31 = extraout_XMM0_Bb_00;
  uVar33 = extraout_XMM0_Bc_00;
  uVar35 = extraout_XMM0_Bd_00;
  if (bVar17) {
    local_164 = 1.0;
    if ((local_25[0] & 1U) == 0) {
      local_164 = 0.0;
    }
    uVar29 = 0;
    uVar31 = 0;
    uVar33 = (undefined1)((uint)local_164 >> 0x10);
    uVar35 = (undefined1)((uint)local_164 >> 0x18);
    local_18->WindowBorderSize = local_164;
  }
  SameLine((float)(CONCAT13(uVar35,CONCAT12(uVar33,CONCAT11(uVar31,uVar29))) ^
                  CONCAT13(uVar35,CONCAT12(uVar33,CONCAT11(uVar31,uVar29)))),-1.0);
  local_26 = 0.0 < local_18->FrameBorderSize;
  bVar17 = Checkbox("FrameBorder",&local_26);
  uVar29 = extraout_XMM0_Ba_01;
  uVar31 = extraout_XMM0_Bb_01;
  uVar33 = extraout_XMM0_Bc_01;
  uVar35 = extraout_XMM0_Bd_01;
  if (bVar17) {
    local_16c = 1.0;
    if ((local_26 & 1U) == 0) {
      local_16c = 0.0;
    }
    uVar29 = 0;
    uVar31 = 0;
    uVar33 = (undefined1)((uint)local_16c >> 0x10);
    uVar35 = (undefined1)((uint)local_16c >> 0x18);
    local_18->FrameBorderSize = local_16c;
  }
  SameLine((float)(CONCAT13(uVar35,CONCAT12(uVar33,CONCAT11(uVar31,uVar29))) ^
                  CONCAT13(uVar35,CONCAT12(uVar33,CONCAT11(uVar31,uVar29)))),-1.0);
  local_27 = 0.0 < local_18->PopupBorderSize;
  bVar17 = Checkbox("PopupBorder",&local_27);
  if (bVar17) {
    local_174 = 1.0;
    if ((local_27 & 1U) == 0) {
      local_174 = 0.0;
    }
    local_18->PopupBorderSize = local_174;
  }
  ImVec2::ImVec2(&local_30,0.0,0.0);
  bVar17 = Button("Save Ref",&local_30);
  uVar29 = extraout_XMM0_Ba_02;
  uVar31 = extraout_XMM0_Bb_02;
  uVar33 = extraout_XMM0_Bc_02;
  uVar35 = extraout_XMM0_Bd_02;
  if (bVar17) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_18,0x338);
    memcpy(style,&ShowStyleEditor::ref_saved_style,0x338);
    uVar29 = extraout_XMM0_Ba_03;
    uVar31 = extraout_XMM0_Bb_03;
    uVar33 = extraout_XMM0_Bc_03;
    uVar35 = extraout_XMM0_Bd_03;
  }
  SameLine((float)(CONCAT13(uVar35,CONCAT12(uVar33,CONCAT11(uVar31,uVar29))) ^
                  CONCAT13(uVar35,CONCAT12(uVar33,CONCAT11(uVar31,uVar29)))),-1.0);
  ImVec2::ImVec2(&local_38,0.0,0.0);
  bVar17 = Button("Revert Ref",&local_38);
  uVar29 = extraout_XMM0_Ba_04;
  uVar31 = extraout_XMM0_Bb_04;
  uVar33 = extraout_XMM0_Bc_04;
  uVar35 = extraout_XMM0_Bd_04;
  if (bVar17) {
    memcpy(local_18,style,0x338);
    uVar29 = extraout_XMM0_Ba_05;
    uVar31 = extraout_XMM0_Bb_05;
    uVar33 = extraout_XMM0_Bc_05;
    uVar35 = extraout_XMM0_Bd_05;
  }
  SameLine((float)(CONCAT13(uVar35,CONCAT12(uVar33,CONCAT11(uVar31,uVar29))) ^
                  CONCAT13(uVar35,CONCAT12(uVar33,CONCAT11(uVar31,uVar29)))),-1.0);
  ShowHelpMarker(
                "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export Colors\" below to save them somewhere."
                );
  bVar17 = TreeNode("Rendering");
  if (bVar17) {
    Checkbox("Anti-aliased lines",&local_18->AntiAliasedLines);
    SameLine((float)(CONCAT13(extraout_XMM0_Bd_06,
                              CONCAT12(extraout_XMM0_Bc_06,
                                       CONCAT11(extraout_XMM0_Bb_06,extraout_XMM0_Ba_06))) ^
                    CONCAT13(extraout_XMM0_Bd_06,
                             CONCAT12(extraout_XMM0_Bc_06,
                                      CONCAT11(extraout_XMM0_Bb_06,extraout_XMM0_Ba_06)))),-1.0);
    ShowHelpMarker(
                  "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                  );
    Checkbox("Anti-aliased fill",&local_18->AntiAliasedFill);
    PushItemWidth(100.0);
    DragFloat("Curve Tessellation Tolerance",&local_18->CurveTessellationTol,0.02,0.1,3.4028235e+38,
              (char *)0x0,2.0);
    fVar5 = (float)(CONCAT13(extraout_XMM0_Bd_07,
                             CONCAT12(extraout_XMM0_Bc_07,
                                      CONCAT11(extraout_XMM0_Bb_07,extraout_XMM0_Ba_07))) ^
                   CONCAT13(extraout_XMM0_Bd_07,
                            CONCAT12(extraout_XMM0_Bc_07,
                                     CONCAT11(extraout_XMM0_Bb_07,extraout_XMM0_Ba_07))));
    if (local_18->CurveTessellationTol <= fVar5 && fVar5 != local_18->CurveTessellationTol) {
      local_18->CurveTessellationTol = 0.1;
    }
    DragFloat("Global Alpha",&local_18->Alpha,0.005,0.2,1.0,"%.2f",1.0);
    PopItemWidth();
    TreePop();
  }
  bVar17 = TreeNode("Settings");
  if (bVar17) {
    SliderFloat2("WindowPadding",&(local_18->WindowPadding).x,
                 (float)(CONCAT13(extraout_XMM0_Bd_08,
                                  CONCAT12(extraout_XMM0_Bc_08,
                                           CONCAT11(extraout_XMM0_Bb_08,extraout_XMM0_Ba_08))) ^
                        CONCAT13(extraout_XMM0_Bd_08,
                                 CONCAT12(extraout_XMM0_Bc_08,
                                          CONCAT11(extraout_XMM0_Bb_08,extraout_XMM0_Ba_08)))),20.0,
                 "%.0f",1.0);
    SliderFloat("PopupRounding",&local_18->PopupRounding,
                (float)(CONCAT13(extraout_XMM0_Bd_09,
                                 CONCAT12(extraout_XMM0_Bc_09,
                                          CONCAT11(extraout_XMM0_Bb_09,extraout_XMM0_Ba_09))) ^
                       CONCAT13(extraout_XMM0_Bd_09,
                                CONCAT12(extraout_XMM0_Bc_09,
                                         CONCAT11(extraout_XMM0_Bb_09,extraout_XMM0_Ba_09)))),16.0,
                "%.0f",1.0);
    SliderFloat2("FramePadding",&(local_18->FramePadding).x,
                 (float)(CONCAT13(extraout_XMM0_Bd_10,
                                  CONCAT12(extraout_XMM0_Bc_10,
                                           CONCAT11(extraout_XMM0_Bb_10,extraout_XMM0_Ba_10))) ^
                        CONCAT13(extraout_XMM0_Bd_10,
                                 CONCAT12(extraout_XMM0_Bc_10,
                                          CONCAT11(extraout_XMM0_Bb_10,extraout_XMM0_Ba_10)))),20.0,
                 "%.0f",1.0);
    SliderFloat2("ItemSpacing",&(local_18->ItemSpacing).x,
                 (float)(CONCAT13(extraout_XMM0_Bd_11,
                                  CONCAT12(extraout_XMM0_Bc_11,
                                           CONCAT11(extraout_XMM0_Bb_11,extraout_XMM0_Ba_11))) ^
                        CONCAT13(extraout_XMM0_Bd_11,
                                 CONCAT12(extraout_XMM0_Bc_11,
                                          CONCAT11(extraout_XMM0_Bb_11,extraout_XMM0_Ba_11)))),20.0,
                 "%.0f",1.0);
    SliderFloat2("ItemInnerSpacing",&(local_18->ItemInnerSpacing).x,
                 (float)(CONCAT13(extraout_XMM0_Bd_12,
                                  CONCAT12(extraout_XMM0_Bc_12,
                                           CONCAT11(extraout_XMM0_Bb_12,extraout_XMM0_Ba_12))) ^
                        CONCAT13(extraout_XMM0_Bd_12,
                                 CONCAT12(extraout_XMM0_Bc_12,
                                          CONCAT11(extraout_XMM0_Bb_12,extraout_XMM0_Ba_12)))),20.0,
                 "%.0f",1.0);
    SliderFloat2("TouchExtraPadding",&(local_18->TouchExtraPadding).x,
                 (float)(CONCAT13(extraout_XMM0_Bd_13,
                                  CONCAT12(extraout_XMM0_Bc_13,
                                           CONCAT11(extraout_XMM0_Bb_13,extraout_XMM0_Ba_13))) ^
                        CONCAT13(extraout_XMM0_Bd_13,
                                 CONCAT12(extraout_XMM0_Bc_13,
                                          CONCAT11(extraout_XMM0_Bb_13,extraout_XMM0_Ba_13)))),10.0,
                 "%.0f",1.0);
    SliderFloat("IndentSpacing",&local_18->IndentSpacing,
                (float)(CONCAT13(extraout_XMM0_Bd_14,
                                 CONCAT12(extraout_XMM0_Bc_14,
                                          CONCAT11(extraout_XMM0_Bb_14,extraout_XMM0_Ba_14))) ^
                       CONCAT13(extraout_XMM0_Bd_14,
                                CONCAT12(extraout_XMM0_Bc_14,
                                         CONCAT11(extraout_XMM0_Bb_14,extraout_XMM0_Ba_14)))),30.0,
                "%.0f",1.0);
    SliderFloat("ScrollbarSize",&local_18->ScrollbarSize,1.0,20.0,"%.0f",1.0);
    SliderFloat("GrabMinSize",&local_18->GrabMinSize,1.0,20.0,"%.0f",1.0);
    Text("BorderSize");
    SliderFloat("WindowBorderSize",&local_18->WindowBorderSize,
                (float)(CONCAT13(extraout_XMM0_Bd_15,
                                 CONCAT12(extraout_XMM0_Bc_15,
                                          CONCAT11(extraout_XMM0_Bb_15,extraout_XMM0_Ba_15))) ^
                       CONCAT13(extraout_XMM0_Bd_15,
                                CONCAT12(extraout_XMM0_Bc_15,
                                         CONCAT11(extraout_XMM0_Bb_15,extraout_XMM0_Ba_15)))),1.0,
                "%.0f",1.0);
    SliderFloat("ChildBorderSize",&local_18->ChildBorderSize,
                (float)(CONCAT13(extraout_XMM0_Bd_16,
                                 CONCAT12(extraout_XMM0_Bc_16,
                                          CONCAT11(extraout_XMM0_Bb_16,extraout_XMM0_Ba_16))) ^
                       CONCAT13(extraout_XMM0_Bd_16,
                                CONCAT12(extraout_XMM0_Bc_16,
                                         CONCAT11(extraout_XMM0_Bb_16,extraout_XMM0_Ba_16)))),1.0,
                "%.0f",1.0);
    SliderFloat("PopupBorderSize",&local_18->PopupBorderSize,
                (float)(CONCAT13(extraout_XMM0_Bd_17,
                                 CONCAT12(extraout_XMM0_Bc_17,
                                          CONCAT11(extraout_XMM0_Bb_17,extraout_XMM0_Ba_17))) ^
                       CONCAT13(extraout_XMM0_Bd_17,
                                CONCAT12(extraout_XMM0_Bc_17,
                                         CONCAT11(extraout_XMM0_Bb_17,extraout_XMM0_Ba_17)))),1.0,
                "%.0f",1.0);
    SliderFloat("FrameBorderSize",&local_18->FrameBorderSize,
                (float)(CONCAT13(extraout_XMM0_Bd_18,
                                 CONCAT12(extraout_XMM0_Bc_18,
                                          CONCAT11(extraout_XMM0_Bb_18,extraout_XMM0_Ba_18))) ^
                       CONCAT13(extraout_XMM0_Bd_18,
                                CONCAT12(extraout_XMM0_Bc_18,
                                         CONCAT11(extraout_XMM0_Bb_18,extraout_XMM0_Ba_18)))),1.0,
                "%.0f",1.0);
    Text("Rounding");
    SliderFloat("WindowRounding",&local_18->WindowRounding,
                (float)(CONCAT13(extraout_XMM0_Bd_19,
                                 CONCAT12(extraout_XMM0_Bc_19,
                                          CONCAT11(extraout_XMM0_Bb_19,extraout_XMM0_Ba_19))) ^
                       CONCAT13(extraout_XMM0_Bd_19,
                                CONCAT12(extraout_XMM0_Bc_19,
                                         CONCAT11(extraout_XMM0_Bb_19,extraout_XMM0_Ba_19)))),14.0,
                "%.0f",1.0);
    SliderFloat("ChildRounding",&local_18->ChildRounding,
                (float)(CONCAT13(extraout_XMM0_Bd_20,
                                 CONCAT12(extraout_XMM0_Bc_20,
                                          CONCAT11(extraout_XMM0_Bb_20,extraout_XMM0_Ba_20))) ^
                       CONCAT13(extraout_XMM0_Bd_20,
                                CONCAT12(extraout_XMM0_Bc_20,
                                         CONCAT11(extraout_XMM0_Bb_20,extraout_XMM0_Ba_20)))),16.0,
                "%.0f",1.0);
    SliderFloat("FrameRounding",&local_18->FrameRounding,
                (float)(CONCAT13(extraout_XMM0_Bd_21,
                                 CONCAT12(extraout_XMM0_Bc_21,
                                          CONCAT11(extraout_XMM0_Bb_21,extraout_XMM0_Ba_21))) ^
                       CONCAT13(extraout_XMM0_Bd_21,
                                CONCAT12(extraout_XMM0_Bc_21,
                                         CONCAT11(extraout_XMM0_Bb_21,extraout_XMM0_Ba_21)))),12.0,
                "%.0f",1.0);
    SliderFloat("ScrollbarRounding",&local_18->ScrollbarRounding,
                (float)(CONCAT13(extraout_XMM0_Bd_22,
                                 CONCAT12(extraout_XMM0_Bc_22,
                                          CONCAT11(extraout_XMM0_Bb_22,extraout_XMM0_Ba_22))) ^
                       CONCAT13(extraout_XMM0_Bd_22,
                                CONCAT12(extraout_XMM0_Bc_22,
                                         CONCAT11(extraout_XMM0_Bb_22,extraout_XMM0_Ba_22)))),12.0,
                "%.0f",1.0);
    SliderFloat("GrabRounding",&local_18->GrabRounding,
                (float)(CONCAT13(extraout_XMM0_Bd_23,
                                 CONCAT12(extraout_XMM0_Bc_23,
                                          CONCAT11(extraout_XMM0_Bb_23,extraout_XMM0_Ba_23))) ^
                       CONCAT13(extraout_XMM0_Bd_23,
                                CONCAT12(extraout_XMM0_Bc_23,
                                         CONCAT11(extraout_XMM0_Bb_23,extraout_XMM0_Ba_23)))),12.0,
                "%.0f",1.0);
    Text("Alignment");
    SliderFloat2("WindowTitleAlign",&(local_18->WindowTitleAlign).x,
                 (float)(CONCAT13(extraout_XMM0_Bd_24,
                                  CONCAT12(extraout_XMM0_Bc_24,
                                           CONCAT11(extraout_XMM0_Bb_24,extraout_XMM0_Ba_24))) ^
                        CONCAT13(extraout_XMM0_Bd_24,
                                 CONCAT12(extraout_XMM0_Bc_24,
                                          CONCAT11(extraout_XMM0_Bb_24,extraout_XMM0_Ba_24)))),1.0,
                 "%.2f",1.0);
    SliderFloat2("ButtonTextAlign",&(local_18->ButtonTextAlign).x,
                 (float)(CONCAT13(extraout_XMM0_Bd_25,
                                  CONCAT12(extraout_XMM0_Bc_25,
                                           CONCAT11(extraout_XMM0_Bb_25,extraout_XMM0_Ba_25))) ^
                        CONCAT13(extraout_XMM0_Bd_25,
                                 CONCAT12(extraout_XMM0_Bc_25,
                                          CONCAT11(extraout_XMM0_Bb_25,extraout_XMM0_Ba_25)))),1.0,
                 "%.2f",1.0);
    SameLine((float)(CONCAT13(extraout_XMM0_Bd_26,
                              CONCAT12(extraout_XMM0_Bc_26,
                                       CONCAT11(extraout_XMM0_Bb_26,extraout_XMM0_Ba_26))) ^
                    CONCAT13(extraout_XMM0_Bd_26,
                             CONCAT12(extraout_XMM0_Bc_26,
                                      CONCAT11(extraout_XMM0_Bb_26,extraout_XMM0_Ba_26)))),-1.0);
    ShowHelpMarker("Alignment applies when a button is larger than its text content.");
    Text("Safe Area Padding");
    SameLine((float)(CONCAT13(extraout_XMM0_Bd_27,
                              CONCAT12(extraout_XMM0_Bc_27,
                                       CONCAT11(extraout_XMM0_Bb_27,extraout_XMM0_Ba_27))) ^
                    CONCAT13(extraout_XMM0_Bd_27,
                             CONCAT12(extraout_XMM0_Bc_27,
                                      CONCAT11(extraout_XMM0_Bb_27,extraout_XMM0_Ba_27)))),-1.0);
    ShowHelpMarker(
                  "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                  );
    SliderFloat2("DisplaySafeAreaPadding",&(local_18->DisplaySafeAreaPadding).x,
                 (float)(CONCAT13(extraout_XMM0_Bd_28,
                                  CONCAT12(extraout_XMM0_Bc_28,
                                           CONCAT11(extraout_XMM0_Bb_28,extraout_XMM0_Ba_28))) ^
                        CONCAT13(extraout_XMM0_Bd_28,
                                 CONCAT12(extraout_XMM0_Bc_28,
                                          CONCAT11(extraout_XMM0_Bb_28,extraout_XMM0_Ba_28)))),30.0,
                 "%.0f",1.0);
    TreePop();
  }
  bVar17 = TreeNode("Colors");
  if (bVar17) {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,0.0,0.0);
    bVar17 = Button("Export Unsaved",(ImVec2 *)&stack0xffffffffffffffc0);
    cVar30 = extraout_XMM0_Ba_29;
    cVar32 = extraout_XMM0_Bb_29;
    cVar34 = extraout_XMM0_Bc_29;
    cVar36 = extraout_XMM0_Bd_29;
    if (bVar17) {
      if (ShowStyleEditor::output_dest == 0) {
        LogToClipboard(-1);
      }
      else {
        LogToTTY(-1);
      }
      LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
      for (col._4_4_ = 0; col._4_4_ < 0x2a; col._4_4_ = col._4_4_ + 1) {
        name = (char *)(local_18->Colors + col._4_4_);
        pcVar28 = GetStyleColorName(col._4_4_);
        local_58 = pcVar28;
        if ((ShowStyleEditor::output_only_modified & 1U) == 0) {
LAB_001a0a67:
          sVar21 = strlen(pcVar28);
          LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",
                  CONCAT17(extraout_XMM0_Bh,
                           CONCAT16(extraout_XMM0_Bg,
                                    CONCAT15(extraout_XMM0_Bf,
                                             CONCAT14(extraout_XMM0_Be,
                                                      CONCAT13(cVar36,CONCAT12(cVar34,CONCAT11(
                                                  cVar32,cVar30))))))),(double)*(float *)(name + 4),
                  (double)*(float *)(name + 8),(double)*(float *)(name + 0xc),pcVar28,
                  (ulong)(0x17 - (int)sVar21),"");
        }
        else {
          IVar49 = style->Colors[col._4_4_];
          cVar30 = -(*name == IVar49.x._0_1_);
          cVar32 = -(name[1] == IVar49.x._1_1_);
          cVar34 = -(name[2] == IVar49.x._2_1_);
          cVar36 = -(name[3] == IVar49.x._3_1_);
          cVar37 = -(name[4] == IVar49.y._0_1_);
          cVar38 = -(name[5] == IVar49.y._1_1_);
          cVar39 = -(name[6] == IVar49.y._2_1_);
          cVar40 = -(name[7] == IVar49.y._3_1_);
          cVar41 = -(name[8] == IVar49.z._0_1_);
          cVar42 = -(name[9] == IVar49.z._1_1_);
          cVar43 = -(name[10] == IVar49.z._2_1_);
          cVar44 = -(name[0xb] == IVar49.z._3_1_);
          cVar45 = -(name[0xc] == IVar49.w._0_1_);
          cVar46 = -(name[0xd] == IVar49.w._1_1_);
          cVar47 = -(name[0xe] == IVar49.w._2_1_);
          bVar48 = -(name[0xf] == IVar49.w._3_1_);
          auVar3[1] = cVar32;
          auVar3[0] = cVar30;
          auVar3[2] = cVar34;
          auVar3[3] = cVar36;
          auVar3[4] = cVar37;
          auVar3[5] = cVar38;
          auVar3[6] = cVar39;
          auVar3[7] = cVar40;
          auVar3[8] = cVar41;
          auVar3[9] = cVar42;
          auVar3[10] = cVar43;
          auVar3[0xb] = cVar44;
          auVar3[0xc] = cVar45;
          auVar3[0xd] = cVar46;
          auVar3[0xe] = cVar47;
          auVar3[0xf] = bVar48;
          auVar4[1] = cVar32;
          auVar4[0] = cVar30;
          auVar4[2] = cVar34;
          auVar4[3] = cVar36;
          auVar4[4] = cVar37;
          auVar4[5] = cVar38;
          auVar4[6] = cVar39;
          auVar4[7] = cVar40;
          auVar4[8] = cVar41;
          auVar4[9] = cVar42;
          auVar4[10] = cVar43;
          auVar4[0xb] = cVar44;
          auVar4[0xc] = cVar45;
          auVar4[0xd] = cVar46;
          auVar4[0xe] = cVar47;
          auVar4[0xf] = bVar48;
          auVar14[1] = cVar36;
          auVar14[0] = cVar34;
          auVar14[2] = cVar37;
          auVar14[3] = cVar38;
          auVar14[4] = cVar39;
          auVar14[5] = cVar40;
          auVar14[6] = cVar41;
          auVar14[7] = cVar42;
          auVar14[8] = cVar43;
          auVar14[9] = cVar44;
          auVar14[10] = cVar45;
          auVar14[0xb] = cVar46;
          auVar14[0xc] = cVar47;
          auVar14[0xd] = bVar48;
          auVar12[1] = cVar37;
          auVar12[0] = cVar36;
          auVar12[2] = cVar38;
          auVar12[3] = cVar39;
          auVar12[4] = cVar40;
          auVar12[5] = cVar41;
          auVar12[6] = cVar42;
          auVar12[7] = cVar43;
          auVar12[8] = cVar44;
          auVar12[9] = cVar45;
          auVar12[10] = cVar46;
          auVar12[0xb] = cVar47;
          auVar12[0xc] = bVar48;
          auVar10[1] = cVar38;
          auVar10[0] = cVar37;
          auVar10[2] = cVar39;
          auVar10[3] = cVar40;
          auVar10[4] = cVar41;
          auVar10[5] = cVar42;
          auVar10[6] = cVar43;
          auVar10[7] = cVar44;
          auVar10[8] = cVar45;
          auVar10[9] = cVar46;
          auVar10[10] = cVar47;
          auVar10[0xb] = bVar48;
          auVar8[1] = cVar39;
          auVar8[0] = cVar38;
          auVar8[2] = cVar40;
          auVar8[3] = cVar41;
          auVar8[4] = cVar42;
          auVar8[5] = cVar43;
          auVar8[6] = cVar44;
          auVar8[7] = cVar45;
          auVar8[8] = cVar46;
          auVar8[9] = cVar47;
          auVar8[10] = bVar48;
          if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar48,CONCAT18(cVar47,CONCAT17(cVar46,CONCAT16(
                                                  cVar45,CONCAT15(cVar44,CONCAT14(cVar43,CONCAT13(
                                                  cVar42,CONCAT12(cVar41,CONCAT11(cVar40,cVar39)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar48,CONCAT17(cVar47,CONCAT16(cVar46,CONCAT15(
                                                  cVar45,CONCAT14(cVar44,CONCAT13(cVar43,CONCAT12(
                                                  cVar42,CONCAT11(cVar41,cVar40)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar48 >> 7) << 0xf) != 0xffff) goto LAB_001a0a67;
        }
      }
      LogFinish();
      cVar30 = extraout_XMM0_Ba_30;
      cVar32 = extraout_XMM0_Bb_30;
      cVar34 = extraout_XMM0_Bc_30;
      cVar36 = extraout_XMM0_Bd_30;
    }
    SameLine((float)(CONCAT13(cVar36,CONCAT12(cVar34,CONCAT11(cVar32,cVar30))) ^
                    CONCAT13(cVar36,CONCAT12(cVar34,CONCAT11(cVar32,cVar30)))),-1.0);
    PushItemWidth(120.0);
    Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
    PopItemWidth();
    SameLine((float)(CONCAT13(extraout_XMM0_Bd_31,
                              CONCAT12(extraout_XMM0_Bc_31,
                                       CONCAT11(extraout_XMM0_Bb_31,extraout_XMM0_Ba_31))) ^
                    CONCAT13(extraout_XMM0_Bd_31,
                             CONCAT12(extraout_XMM0_Bc_31,
                                      CONCAT11(extraout_XMM0_Bb_31,extraout_XMM0_Ba_31)))),-1.0);
    Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
    Text(
        "Tip: Left-click on colored square to open color picker,\nRight-click to open edit options menu."
        );
    if ((ShowStyleEditor(ImGuiStyle*)::filter == '\0') &&
       (iVar19 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter), iVar19 != 0)) {
      ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
      __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
    }
    ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",200.0);
    RadioButton("Opaque",&ShowStyleEditor::alpha_flags,0);
    SameLine((float)(CONCAT13(extraout_XMM0_Bd_32,
                              CONCAT12(extraout_XMM0_Bc_32,
                                       CONCAT11(extraout_XMM0_Bb_32,extraout_XMM0_Ba_32))) ^
                    CONCAT13(extraout_XMM0_Bd_32,
                             CONCAT12(extraout_XMM0_Bc_32,
                                      CONCAT11(extraout_XMM0_Bb_32,extraout_XMM0_Ba_32)))),-1.0);
    RadioButton("Alpha",&ShowStyleEditor::alpha_flags,0x20000);
    SameLine((float)(CONCAT13(extraout_XMM0_Bd_33,
                              CONCAT12(extraout_XMM0_Bc_33,
                                       CONCAT11(extraout_XMM0_Bb_33,extraout_XMM0_Ba_33))) ^
                    CONCAT13(extraout_XMM0_Bd_33,
                             CONCAT12(extraout_XMM0_Bc_33,
                                      CONCAT11(extraout_XMM0_Bb_33,extraout_XMM0_Ba_33)))),-1.0);
    RadioButton("Both",&ShowStyleEditor::alpha_flags,0x40000);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,
                   (float)(CONCAT13(extraout_XMM0_Bd_34,
                                    CONCAT12(extraout_XMM0_Bc_34,
                                             CONCAT11(extraout_XMM0_Bb_34,extraout_XMM0_Ba_34))) ^
                          CONCAT13(extraout_XMM0_Bd_34,
                                   CONCAT12(extraout_XMM0_Bc_34,
                                            CONCAT11(extraout_XMM0_Bb_34,extraout_XMM0_Ba_34)))),
                   300.0);
    BeginChild("#colors",(ImVec2 *)&stack0xffffffffffffffa0,true,0x80c000);
    PushItemWidth(-160.0);
    for (name_1._4_4_ = 0; name_1._4_4_ < 0x2a; name_1._4_4_ = name_1._4_4_ + 1) {
      local_70 = GetStyleColorName(name_1._4_4_);
      bVar17 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,local_70,(char *)0x0);
      if (bVar17) {
        PushID(name_1._4_4_);
        ColorEdit4("##color",&local_18->Colors[name_1._4_4_].x,
                   ShowStyleEditor::alpha_flags | 0x10000);
        pIVar22 = local_18->Colors + name_1._4_4_;
        IVar49 = style->Colors[name_1._4_4_];
        cVar30 = -(*(char *)&pIVar22->x == IVar49.x._0_1_);
        cVar32 = -(*(undefined1 *)((long)&pIVar22->x + 1) == IVar49.x._1_1_);
        cVar34 = -(*(undefined1 *)((long)&pIVar22->x + 2) == IVar49.x._2_1_);
        cVar36 = -(*(undefined1 *)((long)&pIVar22->x + 3) == IVar49.x._3_1_);
        cVar37 = -(*(char *)&pIVar22->y == IVar49.y._0_1_);
        cVar38 = -(*(undefined1 *)((long)&pIVar22->y + 1) == IVar49.y._1_1_);
        cVar39 = -(*(undefined1 *)((long)&pIVar22->y + 2) == IVar49.y._2_1_);
        cVar40 = -(*(undefined1 *)((long)&pIVar22->y + 3) == IVar49.y._3_1_);
        cVar41 = -(*(char *)&pIVar22->z == IVar49.z._0_1_);
        cVar42 = -(*(undefined1 *)((long)&pIVar22->z + 1) == IVar49.z._1_1_);
        cVar43 = -(*(undefined1 *)((long)&pIVar22->z + 2) == IVar49.z._2_1_);
        cVar44 = -(*(undefined1 *)((long)&pIVar22->z + 3) == IVar49.z._3_1_);
        cVar45 = -(*(char *)&pIVar22->w == IVar49.w._0_1_);
        cVar46 = -(*(undefined1 *)((long)&pIVar22->w + 1) == IVar49.w._1_1_);
        cVar47 = -(*(undefined1 *)((long)&pIVar22->w + 2) == IVar49.w._2_1_);
        bVar48 = -(*(undefined1 *)((long)&pIVar22->w + 3) == IVar49.w._3_1_);
        auVar1[1] = cVar32;
        auVar1[0] = cVar30;
        auVar1[2] = cVar34;
        auVar1[3] = cVar36;
        auVar1[4] = cVar37;
        auVar1[5] = cVar38;
        auVar1[6] = cVar39;
        auVar1[7] = cVar40;
        auVar1[8] = cVar41;
        auVar1[9] = cVar42;
        auVar1[10] = cVar43;
        auVar1[0xb] = cVar44;
        auVar1[0xc] = cVar45;
        auVar1[0xd] = cVar46;
        auVar1[0xe] = cVar47;
        auVar1[0xf] = bVar48;
        auVar2[1] = cVar32;
        auVar2[0] = cVar30;
        auVar2[2] = cVar34;
        auVar2[3] = cVar36;
        auVar2[4] = cVar37;
        auVar2[5] = cVar38;
        auVar2[6] = cVar39;
        auVar2[7] = cVar40;
        auVar2[8] = cVar41;
        auVar2[9] = cVar42;
        auVar2[10] = cVar43;
        auVar2[0xb] = cVar44;
        auVar2[0xc] = cVar45;
        auVar2[0xd] = cVar46;
        auVar2[0xe] = cVar47;
        auVar2[0xf] = bVar48;
        auVar15[1] = cVar36;
        auVar15[0] = cVar34;
        auVar15[2] = cVar37;
        auVar15[3] = cVar38;
        auVar15[4] = cVar39;
        auVar15[5] = cVar40;
        auVar15[6] = cVar41;
        auVar15[7] = cVar42;
        auVar15[8] = cVar43;
        auVar15[9] = cVar44;
        auVar15[10] = cVar45;
        auVar15[0xb] = cVar46;
        auVar15[0xc] = cVar47;
        auVar15[0xd] = bVar48;
        auVar13[1] = cVar37;
        auVar13[0] = cVar36;
        auVar13[2] = cVar38;
        auVar13[3] = cVar39;
        auVar13[4] = cVar40;
        auVar13[5] = cVar41;
        auVar13[6] = cVar42;
        auVar13[7] = cVar43;
        auVar13[8] = cVar44;
        auVar13[9] = cVar45;
        auVar13[10] = cVar46;
        auVar13[0xb] = cVar47;
        auVar13[0xc] = bVar48;
        auVar11[1] = cVar38;
        auVar11[0] = cVar37;
        auVar11[2] = cVar39;
        auVar11[3] = cVar40;
        auVar11[4] = cVar41;
        auVar11[5] = cVar42;
        auVar11[6] = cVar43;
        auVar11[7] = cVar44;
        auVar11[8] = cVar45;
        auVar11[9] = cVar46;
        auVar11[10] = cVar47;
        auVar11[0xb] = bVar48;
        auVar9[1] = cVar39;
        auVar9[0] = cVar38;
        auVar9[2] = cVar40;
        auVar9[3] = cVar41;
        auVar9[4] = cVar42;
        auVar9[5] = cVar43;
        auVar9[6] = cVar44;
        auVar9[7] = cVar45;
        auVar9[8] = cVar46;
        auVar9[9] = cVar47;
        auVar9[10] = bVar48;
        if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar15 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar48,CONCAT18(cVar47,CONCAT17(cVar46,CONCAT16(cVar45
                                                  ,CONCAT15(cVar44,CONCAT14(cVar43,CONCAT13(cVar42,
                                                  CONCAT12(cVar41,CONCAT11(cVar40,cVar39))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar48,CONCAT17(cVar47,CONCAT16(cVar46,CONCAT15(cVar45
                                                  ,CONCAT14(cVar44,CONCAT13(cVar43,CONCAT12(cVar42,
                                                  CONCAT11(cVar41,cVar40)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar48 >> 7) << 0xf) != 0xffff) {
          SameLine((float)(CONCAT13(cVar36,CONCAT12(cVar34,CONCAT11(cVar32,cVar30))) ^
                          CONCAT13(cVar36,CONCAT12(cVar34,CONCAT11(cVar32,cVar30)))),
                   (local_18->ItemInnerSpacing).x);
          ImVec2::ImVec2(&local_78,0.0,0.0);
          bVar17 = Button("Save",&local_78);
          if (bVar17) {
            pIVar27 = local_18->Colors + name_1._4_4_;
            pIVar22 = style->Colors + name_1._4_4_;
            fVar5 = pIVar27->y;
            pIVar22->x = pIVar27->x;
            pIVar22->y = fVar5;
            fVar5 = pIVar27->w;
            pIVar22->z = pIVar27->z;
            pIVar22->w = fVar5;
          }
          SameLine((float)(CONCAT13(extraout_XMM0_Bd_35,
                                    CONCAT12(extraout_XMM0_Bc_35,
                                             CONCAT11(extraout_XMM0_Bb_35,extraout_XMM0_Ba_35))) ^
                          CONCAT13(extraout_XMM0_Bd_35,
                                   CONCAT12(extraout_XMM0_Bc_35,
                                            CONCAT11(extraout_XMM0_Bb_35,extraout_XMM0_Ba_35)))),
                   (local_18->ItemInnerSpacing).x);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,0.0,0.0);
          bVar17 = Button("Revert",(ImVec2 *)&stack0xffffffffffffff80);
          cVar30 = extraout_XMM0_Ba_36;
          cVar32 = extraout_XMM0_Bb_36;
          cVar34 = extraout_XMM0_Bc_36;
          cVar36 = extraout_XMM0_Bd_36;
          if (bVar17) {
            pIVar27 = style->Colors + name_1._4_4_;
            pIVar22 = local_18->Colors + name_1._4_4_;
            fVar5 = pIVar27->y;
            pIVar22->x = pIVar27->x;
            pIVar22->y = fVar5;
            fVar5 = pIVar27->w;
            pIVar22->z = pIVar27->z;
            pIVar22->w = fVar5;
          }
        }
        SameLine((float)(CONCAT13(cVar36,CONCAT12(cVar34,CONCAT11(cVar32,cVar30))) ^
                        CONCAT13(cVar36,CONCAT12(cVar34,CONCAT11(cVar32,cVar30)))),
                 (local_18->ItemInnerSpacing).x);
        TextUnformatted(local_70,(char *)0x0);
        PopID();
      }
    }
    PopItemWidth();
    EndChild();
    TreePop();
  }
  pIVar23 = GetIO();
  atlas._7_1_ = TreeNode("Fonts","Fonts (%d)",(pIVar23->Fonts->Fonts).Size);
  if ((bool)atlas._7_1_) {
    pIVar23 = GetIO();
    local_90 = pIVar23->Fonts;
    bVar17 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",local_90->TexWidth,
                      local_90->TexHeight);
    if (bVar17) {
      user_texture_id = local_90->TexID;
      ImVec2::ImVec2(&local_98,(float)local_90->TexWidth,(float)local_90->TexHeight);
      ImVec2::ImVec2(&local_a0,0.0,0.0);
      ImVec2::ImVec2(&local_a8,1.0,1.0);
      ImColor::ImColor(&local_c8,0xff,0xff,0xff,0xff);
      IVar49 = ImColor::operator_cast_to_ImVec4(&local_c8);
      local_b8._8_8_ = IVar49._8_8_;
      local_b8._0_8_ = IVar49._0_8_;
      ImColor::ImColor((ImColor *)&stack0xffffffffffffff18,0xff,0xff,0xff,0x80);
      IVar49 = ImColor::operator_cast_to_ImVec4((ImColor *)&stack0xffffffffffffff18);
      local_d8._8_8_ = IVar49._8_8_;
      local_d8._0_8_ = IVar49._0_8_;
      Image(user_texture_id,&local_98,&local_a0,&local_a8,&local_b8,&local_d8);
      TreePop();
    }
    PushItemWidth(100.0);
    for (font._4_4_ = 0; font._4_4_ < (local_90->Fonts).Size; font._4_4_ = font._4_4_ + 1) {
      ppIVar24 = ImVector<ImFont_*>::operator[](&local_90->Fonts,font._4_4_);
      font_00 = *ppIVar24;
      PushID(font_00);
      if (font_00->ConfigData == (ImFontConfig *)0x0) {
        local_1b8 = "";
      }
      else {
        local_1b8 = font_00->ConfigData->Name;
      }
      bVar17 = TreeNode(font_00,"Font %d: \'%s\', %.2f px, %d glyphs",font._4_4_,local_1b8,
                        (font_00->Glyphs).Size);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_37,
                                CONCAT12(extraout_XMM0_Bc_37,
                                         CONCAT11(extraout_XMM0_Bb_37,extraout_XMM0_Ba_37))) ^
                      CONCAT13(extraout_XMM0_Bd_37,
                               CONCAT12(extraout_XMM0_Bc_37,
                                        CONCAT11(extraout_XMM0_Bb_37,extraout_XMM0_Ba_37)))),-1.0);
      bVar18 = SmallButton("Set as default");
      if (bVar18) {
        pIVar23 = GetIO();
        pIVar23->FontDefault = font_00;
      }
      if (bVar17) {
        PushFont(font_00);
        Text("The quick brown fox jumps over the lazy dog");
        PopFont();
        DragFloat("Font scale",&font_00->Scale,0.005,0.3,2.0,"%.1f",1.0);
        InputFloat("Font offset",&(font_00->DisplayOffset).y,1.0,1.0,0,0);
        SameLine((float)(CONCAT13(extraout_XMM0_Bd_38,
                                  CONCAT12(extraout_XMM0_Bc_38,
                                           CONCAT11(extraout_XMM0_Bb_38,extraout_XMM0_Ba_38))) ^
                        CONCAT13(extraout_XMM0_Bd_38,
                                 CONCAT12(extraout_XMM0_Bc_38,
                                          CONCAT11(extraout_XMM0_Bb_38,extraout_XMM0_Ba_38)))),-1.0)
        ;
        ShowHelpMarker(
                      "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)"
                      );
        Text("Ascent: %f, Descent: %f, Height: %f",
             CONCAT17(extraout_XMM0_Bh_00,
                      CONCAT16(extraout_XMM0_Bg_00,
                               CONCAT15(extraout_XMM0_Bf_00,
                                        CONCAT14(extraout_XMM0_Be_00,
                                                 CONCAT13(extraout_XMM0_Bd_38,
                                                          CONCAT12(extraout_XMM0_Bc_38,
                                                                   CONCAT11(extraout_XMM0_Bb_38,
                                                                            extraout_XMM0_Ba_38)))))
                              )),(double)font_00->Descent,
             (double)(font_00->Ascent - font_00->Descent));
        Text("Fallback character: \'%c\' (%d)",(ulong)font_00->FallbackChar,
             (ulong)font_00->FallbackChar);
        iVar19 = font_00->MetricsTotalSurface;
        fVar5 = sqrtf((float)font_00->MetricsTotalSurface);
        fVar6 = sqrtf((float)font_00->MetricsTotalSurface);
        Text("Texture surface: %d pixels (approx) ~ %dx%d",iVar19,(int)fVar5,(int)fVar6);
        for (cfg._0_4_ = 0; (int)cfg < font_00->ConfigDataCount; cfg._0_4_ = (int)cfg + 1) {
          pIVar25 = font_00->ConfigData + (int)cfg;
          if (pIVar25 != (ImFontConfig *)0x0) {
            BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d",(int)cfg,
                       pIVar25->Name,pIVar25->OversampleH,pIVar25->OversampleV,
                       (ulong)(pIVar25->PixelSnapH & 1));
          }
        }
        bVar17 = TreeNode("Glyphs","Glyphs (%d)",(font_00->Glyphs).Size);
        if (bVar17) {
          for (n = 0; n < 0x10000; n = n + 0x100) {
            cell_size = 0.0;
            for (cell_spacing = 0.0; sVar16 = (short)n, (int)cell_spacing < 0x100;
                cell_spacing = (float)((int)cell_spacing + 1)) {
              pIVar26 = ImFont::FindGlyphNoFallback(font_00,sVar16 + SUB42(cell_spacing,0));
              cell_size = (float)((uint)(pIVar26 != (ImFontGlyph *)0x0) + (int)cell_size);
            }
            if (0 < (int)cell_size) {
              pcVar28 = "glyph";
              if (1 < (int)cell_size) {
                pcVar28 = "glyphs";
              }
              bVar17 = TreeNode((void *)(long)n,"U+%04X..U+%04X (%d %s)",n,(ulong)(n + 0xff),
                                cell_size,pcVar28);
              if (bVar17) {
                fVar5 = font_00->FontSize;
                fVar6 = (local_18->ItemSpacing).y;
                IVar7 = GetCursorScreenPos();
                this = GetWindowDrawList();
                for (cell_p1.x = 0.0; (int)cell_p1.x < 0x100;
                    cell_p1.x = (float)((int)cell_p1.x + 1)) {
                  draw_list._4_4_ = IVar7.x;
                  fStack_120 = IVar7.y;
                  ImVec2::ImVec2(&cell_p2,(float)((int)cell_p1.x % 0x10) * (fVar5 + fVar6) +
                                          draw_list._4_4_,
                                 (float)((int)cell_p1.x / 0x10) * (fVar5 + fVar6) + fStack_120);
                  ImVec2::ImVec2((ImVec2 *)((long)&glyph + 4),cell_p2.x + fVar5,cell_p2.y + fVar5);
                  local_150 = ImFont::FindGlyphNoFallback(font_00,sVar16 + SUB42(cell_p1.x,0));
                  IVar20 = 0x32ffffff;
                  if (local_150 != (ImFontGlyph *)0x0) {
                    IVar20 = 0x64ffffff;
                  }
                  ImDrawList::AddRect(this,&cell_p2,(ImVec2 *)((long)&glyph + 4),IVar20,
                                      (float)(CONCAT13(extraout_XMM0_Bd_39,
                                                       CONCAT12(extraout_XMM0_Bc_39,
                                                                CONCAT11(extraout_XMM0_Bb_39,
                                                                         extraout_XMM0_Ba_39))) ^
                                             CONCAT13(extraout_XMM0_Bd_39,
                                                      CONCAT12(extraout_XMM0_Bc_39,
                                                               CONCAT11(extraout_XMM0_Bb_39,
                                                                        extraout_XMM0_Ba_39)))),0xf,
                                      1.0);
                  if (local_150 != (ImFontGlyph *)0x0) {
                    local_158.y = cell_p2.y;
                    local_158.x = cell_p2.x;
                    IVar20 = GetColorU32(0,1.0);
                    ImFont::RenderChar(font_00,this,fVar5,local_158,IVar20,
                                       sVar16 + SUB42(cell_p1.x,0));
                  }
                  if ((local_150 != (ImFontGlyph *)0x0) &&
                     (bVar17 = IsMouseHoveringRect(&cell_p2,(ImVec2 *)((long)&glyph + 4),true),
                     bVar17)) {
                    BeginTooltip();
                    Text("Codepoint: U+%04X",(ulong)(uint)(n + (int)cell_p1.x));
                    Separator();
                    Text("AdvanceX: %.1f");
                    Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",
                         CONCAT17(extraout_XMM0_Bh_01,
                                  CONCAT16(extraout_XMM0_Bg_01,
                                           CONCAT15(extraout_XMM0_Bf_01,
                                                    CONCAT14(extraout_XMM0_Be_01,
                                                             CONCAT13(extraout_XMM0_Bd_39,
                                                                      CONCAT12(extraout_XMM0_Bc_39,
                                                                               CONCAT11(
                                                  extraout_XMM0_Bb_39,extraout_XMM0_Ba_39))))))),
                         (double)local_150->Y0,(double)local_150->X1,(double)local_150->Y1);
                    Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",
                         CONCAT17(extraout_XMM0_Bh_02,
                                  CONCAT16(extraout_XMM0_Bg_02,
                                           CONCAT15(extraout_XMM0_Bf_02,
                                                    CONCAT14(extraout_XMM0_Be_02,
                                                             CONCAT13(extraout_XMM0_Bd_39,
                                                                      CONCAT12(extraout_XMM0_Bc_39,
                                                                               CONCAT11(
                                                  extraout_XMM0_Bb_39,extraout_XMM0_Ba_39))))))),
                         (double)local_150->V0,(double)local_150->U1,(double)local_150->V1);
                    EndTooltip();
                  }
                }
                ImVec2::ImVec2(&local_160,(fVar5 + fVar6) * 16.0,(fVar5 + fVar6) * 16.0);
                Dummy(&local_160);
                TreePop();
              }
            }
          }
          TreePop();
        }
        TreePop();
      }
      PopID();
    }
    DragFloat("this window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.1f",1.0);
    pIVar23 = GetIO();
    DragFloat("global scale",&pIVar23->FontGlobalScale,0.005,0.3,2.0,"%.1f",1.0);
    PopItemWidth();
    SetWindowFontScale(ShowStyleEditor::window_scale);
    TreePop();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to (else it compares to an internally stored reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool window_border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &window_border)) style.WindowBorderSize = window_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool frame_border = (style.FrameBorderSize > 0.0f); if (ImGui::Checkbox("FrameBorder", &frame_border)) style.FrameBorderSize = frame_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool popup_border = (style.PopupBorderSize > 0.0f); if (ImGui::Checkbox("PopupBorder", &popup_border)) style.PopupBorderSize = popup_border ? 1.0f : 0.0f; }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    ShowHelpMarker("Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export Colors\" below to save them somewhere.");

    if (ImGui::TreeNode("Rendering"))
    {
        ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines); ImGui::SameLine(); ShowHelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");
        ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
        ImGui::PushItemWidth(100);
        ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, FLT_MAX, NULL, 2.0f);
        if (style.CurveTessellationTol < 0.0f) style.CurveTessellationTol = 0.10f;
        ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
        ImGui::PopItemWidth();
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Settings"))
    {
        ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 16.0f, "%.0f");
        ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
        ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
        ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
        ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
        ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
        ImGui::Text("BorderSize");
        ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
        ImGui::Text("Rounding");
        ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 14.0f, "%.0f");
        ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 16.0f, "%.0f");
        ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
        ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
        ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
        ImGui::Text("Alignment");
        ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
        ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); ShowHelpMarker("Alignment applies when a button is larger than its text content.");
        ImGui::Text("Safe Area Padding"); ImGui::SameLine(); ShowHelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
        ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Colors"))
    {
        static int output_dest = 0;
        static bool output_only_modified = true;
        if (ImGui::Button("Export Unsaved"))
        {
            if (output_dest == 0)
                ImGui::LogToClipboard();
            else
                ImGui::LogToTTY();
            ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const ImVec4& col = style.Colors[i];
                const char* name = ImGui::GetStyleColorName(i);
                if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                    ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE, name, 23-(int)strlen(name), "", col.x, col.y, col.z, col.w);
            }
            ImGui::LogFinish();
        }
        ImGui::SameLine(); ImGui::PushItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0"); ImGui::PopItemWidth();
        ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

        ImGui::Text("Tip: Left-click on colored square to open color picker,\nRight-click to open edit options menu.");

        static ImGuiTextFilter filter;
        filter.Draw("Filter colors", 200);

        static ImGuiColorEditFlags alpha_flags = 0;
        ImGui::RadioButton("Opaque", &alpha_flags, 0); ImGui::SameLine();
        ImGui::RadioButton("Alpha", &alpha_flags, ImGuiColorEditFlags_AlphaPreview); ImGui::SameLine();
        ImGui::RadioButton("Both", &alpha_flags, ImGuiColorEditFlags_AlphaPreviewHalf);

        ImGui::BeginChild("#colors", ImVec2(0, 300), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
        ImGui::PushItemWidth(-160);
        for (int i = 0; i < ImGuiCol_COUNT; i++)
        {
            const char* name = ImGui::GetStyleColorName(i);
            if (!filter.PassFilter(name))
                continue;
            ImGui::PushID(i);
            ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
            if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
            {
                // Tips: in a real user application, you may want to merge and use an icon font into the main font, so instead of "Save"/"Revert" you'd use icons.
                // Read the FAQ and misc/fonts/README.txt about using icon fonts. It's really easy and super convenient!
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) ref->Colors[i] = style.Colors[i];
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) style.Colors[i] = ref->Colors[i];
            }
            ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
            ImGui::TextUnformatted(name);
            ImGui::PopID();
        }
        ImGui::PopItemWidth();
        ImGui::EndChild();

        ImGui::TreePop();
    }

    bool fonts_opened = ImGui::TreeNode("Fonts", "Fonts (%d)", ImGui::GetIO().Fonts->Fonts.Size);
    if (fonts_opened)
    {
        ImFontAtlas* atlas = ImGui::GetIO().Fonts;
        if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
        {
            ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0,0), ImVec2(1,1), ImColor(255,255,255,255), ImColor(255,255,255,128));
            ImGui::TreePop();
        }
        ImGui::PushItemWidth(100);
        for (int i = 0; i < atlas->Fonts.Size; i++)
        {
            ImFont* font = atlas->Fonts[i];
            ImGui::PushID(font);
            bool font_details_opened = ImGui::TreeNode(font, "Font %d: \'%s\', %.2f px, %d glyphs", i, font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size);
            ImGui::SameLine(); if (ImGui::SmallButton("Set as default")) ImGui::GetIO().FontDefault = font;
            if (font_details_opened)
            {
                ImGui::PushFont(font);
                ImGui::Text("The quick brown fox jumps over the lazy dog");
                ImGui::PopFont();
                ImGui::DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");   // Scale only this font
                ImGui::InputFloat("Font offset", &font->DisplayOffset.y, 1, 1, 0);
                ImGui::SameLine(); ShowHelpMarker("Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)");
                ImGui::Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
                ImGui::Text("Fallback character: '%c' (%d)", font->FallbackChar, font->FallbackChar);
                ImGui::Text("Texture surface: %d pixels (approx) ~ %dx%d", font->MetricsTotalSurface, (int)sqrtf((float)font->MetricsTotalSurface), (int)sqrtf((float)font->MetricsTotalSurface));
                for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
                    if (ImFontConfig* cfg = &font->ConfigData[config_i])
                        ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d", config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH);
                if (ImGui::TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
                {
                    // Display all glyphs of the fonts in separate pages of 256 characters
                    for (int base = 0; base < 0x10000; base += 256)
                    {
                        int count = 0;
                        for (int n = 0; n < 256; n++)
                            count += font->FindGlyphNoFallback((ImWchar)(base + n)) ? 1 : 0;
                        if (count > 0 && ImGui::TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base+255, count, count > 1 ? "glyphs" : "glyph"))
                        {
                            float cell_size = font->FontSize * 1;
                            float cell_spacing = style.ItemSpacing.y;
                            ImVec2 base_pos = ImGui::GetCursorScreenPos();
                            ImDrawList* draw_list = ImGui::GetWindowDrawList();
                            for (int n = 0; n < 256; n++)
                            {
                                ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                                ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                                const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base+n));
                                draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255,255,255,100) : IM_COL32(255,255,255,50));
                                if (glyph)
                                    font->RenderChar(draw_list, cell_size, cell_p1, ImGui::GetColorU32(ImGuiCol_Text), (ImWchar)(base+n)); // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions available to generate a string.
                                if (glyph && ImGui::IsMouseHoveringRect(cell_p1, cell_p2))
                                {
                                    ImGui::BeginTooltip();
                                    ImGui::Text("Codepoint: U+%04X", base+n);
                                    ImGui::Separator();
                                    ImGui::Text("AdvanceX: %.1f", glyph->AdvanceX);
                                    ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                                    ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                                    ImGui::EndTooltip();
                                }
                            }
                            ImGui::Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
                            ImGui::TreePop();
                        }
                    }
                    ImGui::TreePop();
                }
                ImGui::TreePop();
            }
            ImGui::PopID();
        }
        static float window_scale = 1.0f;
        ImGui::DragFloat("this window scale", &window_scale, 0.005f, 0.3f, 2.0f, "%.1f");              // scale only this window
        ImGui::DragFloat("global scale", &ImGui::GetIO().FontGlobalScale, 0.005f, 0.3f, 2.0f, "%.1f"); // scale everything
        ImGui::PopItemWidth();
        ImGui::SetWindowFontScale(window_scale);
        ImGui::TreePop();
    }

    ImGui::PopItemWidth();
}